

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O1

void sys_vgui(char *fmt,...)

{
  _instanceinter *p_Var1;
  char in_AL;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ssize_t sVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t __n;
  uint uVar6;
  undefined8 in_RSI;
  ulong uVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  p_Var1 = pd_maininstance.pd_inter;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((pd_maininstance.pd_inter)->i_havegui != 0) {
    local_e0 = in_RSI;
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    if ((pd_maininstance.pd_inter)->i_guibuf == (char *)0x0) {
      uVar7 = 0x2000;
      pcVar4 = (char *)malloc(0x2000);
      p_Var1->i_guibuf = pcVar4;
      p_Var1 = pd_maininstance.pd_inter;
      if (pcVar4 == (char *)0x0) {
        sys_vgui_cold_3();
        if ((int)uVar7 < 0) {
          pcVar4 = (char *)0x0;
        }
        else {
          pcVar4 = (char *)realloc((pd_maininstance.pd_inter)->i_guibuf,uVar7 & 0xffffffff);
        }
        p_Var1 = pd_maininstance.pd_inter;
        if (pcVar4 == (char *)0x0) {
          __n = (long)(pd_maininstance.pd_inter)->i_guihead -
                (long)(pd_maininstance.pd_inter)->i_guitail;
          uVar6 = 0;
          do {
            uVar7 = (ulong)(uint)(pd_maininstance.pd_inter)->i_guisock;
            sVar5 = send((pd_maininstance.pd_inter)->i_guisock,
                         (pd_maininstance.pd_inter)->i_guibuf +
                         (ulong)uVar6 + (long)(pd_maininstance.pd_inter)->i_guitail,__n,0);
            if ((int)sVar5 < 0) {
              sys_trytogetmoreguibuf_cold_1();
              sys_vgui("%s",uVar7);
              return;
            }
            uVar6 = uVar6 + (int)sVar5;
          } while ((int)uVar6 < (int)__n);
          p_Var1 = pd_maininstance.pd_inter;
          p_Var1->i_guihead = 0;
          p_Var1->i_guitail = 0;
        }
        else {
          (pd_maininstance.pd_inter)->i_guisize = (int)uVar7;
          p_Var1->i_guibuf = pcVar4;
        }
        return;
      }
      (pd_maininstance.pd_inter)->i_guisize = 0x2000;
      p_Var1->i_guihead = 0;
      p_Var1->i_guitail = 0;
    }
    if ((pd_maininstance.pd_inter)->i_guisize + -0x1000 < (pd_maininstance.pd_inter)->i_guihead) {
      sys_trytogetmoreguibuf((pd_maininstance.pd_inter)->i_guisize + 0x2000);
    }
    local_108 = 0x3000000008;
    local_100 = &ap[0].overflow_arg_area;
    local_f8 = local_e8;
    iVar2 = vsnprintf((pd_maininstance.pd_inter)->i_guibuf + (pd_maininstance.pd_inter)->i_guihead,
                      (long)(pd_maininstance.pd_inter)->i_guisize -
                      (long)(pd_maininstance.pd_inter)->i_guihead,fmt,&local_108);
    if (iVar2 < 0) {
      sys_vgui_cold_2();
    }
    else {
      if ((pd_maininstance.pd_inter)->i_guisize - (pd_maininstance.pd_inter)->i_guihead <= iVar2) {
        iVar3 = 0x2000;
        if (0x2000 < iVar2) {
          iVar3 = iVar2;
        }
        sys_trytogetmoreguibuf(iVar3 + (pd_maininstance.pd_inter)->i_guisize + 1);
        local_108 = 0x3000000008;
        local_100 = &ap[0].overflow_arg_area;
        local_f8 = local_e8;
        iVar3 = vsnprintf((pd_maininstance.pd_inter)->i_guibuf +
                          (pd_maininstance.pd_inter)->i_guihead,
                          (long)(pd_maininstance.pd_inter)->i_guisize -
                          (long)(pd_maininstance.pd_inter)->i_guihead,fmt,&local_108);
        if (iVar3 != iVar2) {
          bug("sys_vgui");
        }
        iVar3 = (pd_maininstance.pd_inter)->i_guisize - (pd_maininstance.pd_inter)->i_guihead;
        if (iVar3 <= iVar2) {
          iVar2 = iVar3;
        }
      }
      if ((sys_debuglevel & 1U) != 0) {
        sys_vgui_cold_1();
      }
      p_Var1 = pd_maininstance.pd_inter;
      (pd_maininstance.pd_inter)->i_guihead = (pd_maininstance.pd_inter)->i_guihead + iVar2;
      p_Var1->i_bytessincelastping = p_Var1->i_bytessincelastping + iVar2;
    }
  }
  return;
}

Assistant:

void sys_vgui(const char *fmt, ...)
{
    int msglen, bytesleft, headwas, nwrote;
    va_list ap;

    if (!sys_havegui())
        return;
    if (!INTER->i_guibuf)
    {
        if (!(INTER->i_guibuf = malloc(GUI_ALLOCCHUNK)))
        {
            fprintf(stderr, "Pd: couldn't allocate GUI buffer\n");
            sys_bail(1);
        }
        INTER->i_guisize = GUI_ALLOCCHUNK;
        INTER->i_guihead = INTER->i_guitail = 0;
    }
    if (INTER->i_guihead > INTER->i_guisize - (GUI_ALLOCCHUNK/2)) {
            sys_trytogetmoreguibuf(INTER->i_guisize + GUI_ALLOCCHUNK);
    }
    va_start(ap, fmt);
    msglen = vsnprintf(
        INTER->i_guibuf  + INTER->i_guihead,
        INTER->i_guisize - INTER->i_guihead,
        fmt, ap);
    va_end(ap);
    if(msglen < 0)
    {
        fprintf(stderr,
            "Pd: buffer space wasn't sufficient for long GUI string\n");
        return;
    }
    if (msglen >= INTER->i_guisize - INTER->i_guihead)
    {
        int msglen2, newsize =
            INTER->i_guisize
            + 1
            + (msglen > GUI_ALLOCCHUNK ? msglen : GUI_ALLOCCHUNK);
        sys_trytogetmoreguibuf(newsize);

        va_start(ap, fmt);
        msglen2 = vsnprintf(
            INTER->i_guibuf  + INTER->i_guihead,
            INTER->i_guisize - INTER->i_guihead,
            fmt, ap);
        va_end(ap);
        if (msglen2 != msglen)
            bug("sys_vgui");
        if (msglen >= INTER->i_guisize - INTER->i_guihead)
            msglen  = INTER->i_guisize - INTER->i_guihead;
    }
    if (sys_debuglevel & DEBUG_MESSUP)
    {
        const char *mess = INTER->i_guibuf + INTER->i_guihead;
        int colorize = stderr_isatty && (sys_debuglevel & DEBUG_COLORIZE);
        static int newmess = 1;
#ifdef _WIN32
    #ifdef _MSC_VER
        fwprintf(stderr, L"%S", mess);
    #else
        fwprintf(stderr, L"%s", mess);
    #endif
        fflush(stderr);
#else
        if (colorize)
            fprintf(stderr, "\e[0;1;35m%s%s\e[0m", (newmess)?">> ":"", mess);
        else
            fprintf(stderr, "%s%s", (newmess)?">> ":"", mess);

        newmess = ('\n' == mess[msglen-1]);
#endif
    }
    INTER->i_guihead += msglen;
    INTER->i_bytessincelastping += msglen;
}